

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::BufferIoExecutor::declareBufferBlocks(ostream *src,ShaderSpec *spec)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer pSVar4;
  DeclareStructTypePtr DVar5;
  DeclareStructTypePtr local_e8;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_d8;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_d0;
  const_iterator symIter_1;
  StructType outputStruct;
  DeclareStructTypePtr local_80 [2];
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_60;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_58;
  const_iterator symIter;
  StructType inputStruct;
  ShaderSpec *spec_local;
  ostream *src_local;
  
  bVar1 = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::empty(&spec->inputs);
  if (!bVar1) {
    glu::StructType::StructType((StructType *)&symIter,"Inputs");
    local_58._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::begin(&spec->inputs);
    while( true ) {
      local_60._M_current =
           (Symbol *)
           std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::end(&spec->inputs);
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
      ::operator->(&local_58);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_58);
      glu::StructType::addMember((StructType *)&symIter,pcVar3,&pSVar4->varType);
      __gnu_cxx::
      __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
      ::operator++(&local_58);
    }
    DVar5 = glu::declare((StructType *)&symIter,0);
    local_80[0].structPtr = DVar5.structPtr;
    local_80[0].indentLevel = DVar5.indentLevel;
    poVar2 = glu::decl::operator<<(src,local_80);
    std::operator<<(poVar2,";\n");
    glu::StructType::~StructType((StructType *)&symIter);
  }
  glu::StructType::StructType((StructType *)&symIter_1,"Outputs");
  local_d0._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&spec->outputs);
  while( true ) {
    local_d8._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&spec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_d0,&local_d8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator->(&local_d0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_d0);
    glu::StructType::addMember((StructType *)&symIter_1,pcVar3,&pSVar4->varType);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_d0);
  }
  DVar5 = glu::declare((StructType *)&symIter_1,0);
  local_e8.structPtr = DVar5.structPtr;
  local_e8.indentLevel = DVar5.indentLevel;
  poVar2 = glu::decl::operator<<(src,&local_e8);
  std::operator<<(poVar2,";\n");
  glu::StructType::~StructType((StructType *)&symIter_1);
  std::operator<<(src,"\n");
  bVar1 = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::empty(&spec->inputs);
  if (!bVar1) {
    poVar2 = std::operator<<(src,"layout(binding = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,", std430) buffer InBuffer\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tInputs inputs[];\n");
    std::operator<<(poVar2,"};\n");
  }
  poVar2 = std::operator<<(src,"layout(binding = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
  poVar2 = std::operator<<(poVar2,", std430) buffer OutBuffer\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tOutputs outputs[];\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void BufferIoExecutor::declareBufferBlocks (std::ostream& src, const ShaderSpec& spec)
{
	// Input struct
	if (!spec.inputs.empty())
	{
		glu::StructType inputStruct("Inputs");
		for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
			inputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&inputStruct) << ";\n";
	}

	// Output struct
	{
		glu::StructType outputStruct("Outputs");
		for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
			outputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&outputStruct) << ";\n";
	}

	src << "\n";

	if (!spec.inputs.empty())
	{
		src	<< "layout(binding = " << int(INPUT_BUFFER_BINDING) << ", std430) buffer InBuffer\n"
			<< "{\n"
			<< "	Inputs inputs[];\n"
			<< "};\n";
	}

	src	<< "layout(binding = " << int(OUTPUT_BUFFER_BINDING) << ", std430) buffer OutBuffer\n"
		<< "{\n"
		<< "	Outputs outputs[];\n"
		<< "};\n"
		<< "\n";
}